

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  byte *__src;
  size_t __n;
  SmallBuffer *in_RSI;
  SmallBuffer *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  SmallBuffer *in_stack_ffffffffffffffd0;
  byte *__dest;
  
  if (in_RDI != in_RSI) {
    size(in_RSI);
    resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __dest = in_RDI->heap;
    __src = in_RSI->heap;
    __n = size(in_RSI);
    memcpy(__dest,__src,__n);
  }
  return in_RDI;
}

Assistant:

SmallBuffer& operator=(const SmallBuffer& sb)
    {
        if (this == &sb) {
            return *this;
        }
        resize(sb.size());
        std::memcpy(heap, sb.heap, sb.size());
        return *this;
    }